

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::NextLetConstGlobal
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,int *index,
          RootObjectBase *instance,PropertyRecord **propertyRecord,Var *value,bool *isConst)

{
  byte bVar1;
  SimpleDictionaryPropertyDescriptor<int> *pSVar2;
  JavascriptString **ppJVar3;
  Var pvVar4;
  int index_00;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord_1;
  Var *local_48;
  ScriptContext *local_40;
  int local_34;
  
  index_00 = *index;
  this_00 = (this->propertyMap).ptr;
  if (index_00 < this_00->count - this_00->freeCount) {
    local_40 = (((((instance->super_DynamicObject).super_RecyclableObject.type.ptr)->
                 javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    propertyRecord_1 = (PropertyRecord *)isConst;
    local_48 = value;
    do {
      pSVar2 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_00,index_00);
      bVar1 = pSVar2->Attributes;
      if ((bVar1 & 0x10) != 0) {
        local_34 = pSVar2->propertyIndex;
        ppJVar3 = JsUtil::
                  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                  ::GetKeyAt((this->propertyMap).ptr,*index);
        ScriptContext::GetOrAddPropertyRecord(local_40,*ppJVar3,&local_58);
        *propertyRecord = local_58;
        pvVar4 = DynamicObject::GetSlot(&instance->super_DynamicObject,local_34);
        *local_48 = pvVar4;
        *(byte *)&(propertyRecord_1->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject = bVar1 >> 7;
        *index = *index + 1;
        return true;
      }
      index_00 = *index + 1;
      *index = index_00;
      this_00 = (this->propertyMap).ptr;
    } while (index_00 < this_00->count - this_00->freeCount);
  }
  return false;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::NextLetConstGlobal(int& index, RootObjectBase* instance, const PropertyRecord** propertyRecord, Var* value, bool* isConst)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        for (; index < propertyMap->Count(); index++)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor = propertyMap->GetValueAt(index);

            if (descriptor.Attributes & PropertyLetConstGlobal)
            {
                *propertyRecord = TMapKey_ConvertKey<const PropertyRecord*>(scriptContext, propertyMap->GetKeyAt(index));
                *value = instance->GetSlot(descriptor.propertyIndex);
                *isConst = (descriptor.Attributes & PropertyConst) != 0;

                index += 1;

                return true;
            }
        }

        return false;
    }